

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

object * __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
          (accessor<pybind11::detail::accessor_policies::tuple_item> *this)

{
  object oStack_18;
  
  if ((this->cache).super_handle.m_ptr == (PyObject *)0x0) {
    accessor_policies::tuple_item::get<unsigned_long,_0>
              ((tuple_item *)&oStack_18,(this->obj).m_ptr,&this->key);
    object::operator=(&this->cache,&oStack_18);
    object::~object(&oStack_18);
  }
  return &this->cache;
}

Assistant:

object &get_cache() const {
        if (!cache) {
            cache = Policy::get(obj, key);
        }
        return cache;
    }